

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::Update
          (DataTable *this,TableUpdateState *state,ClientContext *context,Vector *row_ids,
          vector<duckdb::PhysicalIndex,_true> *column_ids,DataChunk *updates)

{
  TransactionData transaction;
  type state_00;
  idx_t count_p;
  LocalStorage *this_00;
  DuckTransaction *this_01;
  RowGroupCollection *this_02;
  TransactionException *this_03;
  idx_t iVar1;
  SelectionVector sel_local_update;
  SelectionVector sel_global_update;
  LogicalType local_1b0;
  DataChunk updates_slice;
  TransactionData local_158;
  Vector row_ids_slice;
  string local_d8;
  string local_b8;
  Vector max_row_id_vec;
  
  DataChunk::Verify(updates);
  iVar1 = updates->count;
  if (iVar1 != 0) {
    if ((this->version)._M_i != MAIN_TABLE) {
      this_03 = (TransactionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&max_row_id_vec,
                 "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction"
                 ,(allocator *)&row_ids_slice);
      GetTableName_abi_cxx11_(&local_b8,this);
      TableModification_abi_cxx11_(&local_d8,this);
      TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
                (this_03,(string *)&max_row_id_vec,&local_b8,&local_d8);
      __cxa_throw(this_03,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    state_00 = unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>
               ::operator*(&state->constraint_state);
    VerifyUpdateConstraints((DataTable *)state,state_00,context,updates,column_ids);
    Value::BIGINT((Value *)&row_ids_slice,0x7ffffffffff080);
    Vector::Vector(&max_row_id_vec,(Value *)&row_ids_slice);
    Value::~Value((Value *)&row_ids_slice);
    LogicalType::LogicalType(&local_1b0,BIGINT);
    Vector::Vector(&row_ids_slice,&local_1b0,0x800);
    LogicalType::~LogicalType(&local_1b0);
    DataChunk::DataChunk(&updates_slice);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&sel_local_update,updates);
    DataChunk::InitializeEmpty
              (&updates_slice,(vector<duckdb::LogicalType,_true> *)&sel_local_update);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &sel_local_update);
    SelectionVector::SelectionVector(&sel_local_update,iVar1);
    SelectionVector::SelectionVector(&sel_global_update,iVar1);
    count_p = VectorOperations::GreaterThanEquals
                        (row_ids,&max_row_id_vec,
                         (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,iVar1,
                         &sel_local_update,&sel_global_update,
                         (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    if (count_p != 0) {
      DataChunk::Slice(&updates_slice,updates,&sel_local_update,count_p,0);
      DataChunk::Flatten(&updates_slice);
      Vector::Slice(&row_ids_slice,row_ids,&sel_local_update,count_p);
      Vector::Flatten(&row_ids_slice,count_p);
      this_00 = LocalStorage::Get(context,this->db);
      LocalStorage::Update(this_00,this,&row_ids_slice,column_ids,&updates_slice);
    }
    if (iVar1 != count_p) {
      this_01 = DuckTransaction::Get(context,this->db);
      DuckTransaction::ModifyTable(this_01,this);
      iVar1 = iVar1 - count_p;
      DataChunk::Slice(&updates_slice,updates,&sel_global_update,iVar1,0);
      DataChunk::Flatten(&updates_slice);
      Vector::Slice(&row_ids_slice,row_ids,&sel_global_update,iVar1);
      Vector::Flatten(&row_ids_slice,iVar1);
      this_02 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
      TransactionData::TransactionData(&local_158,this_01);
      transaction.transaction_id = local_158.transaction_id;
      transaction.transaction.ptr = local_158.transaction.ptr;
      transaction.start_time = local_158.start_time;
      RowGroupCollection::Update
                (this_02,transaction,(row_t *)row_ids_slice.data,column_ids,&updates_slice);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_global_update.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_local_update.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    DataChunk::~DataChunk(&updates_slice);
    Vector::~Vector(&row_ids_slice);
    Vector::~Vector(&max_row_id_vec);
  }
  return;
}

Assistant:

void DataTable::Update(TableUpdateState &state, ClientContext &context, Vector &row_ids,
                       const vector<PhysicalIndex> &column_ids, DataChunk &updates) {
	D_ASSERT(row_ids.GetType().InternalType() == ROW_TYPE);
	D_ASSERT(column_ids.size() == updates.ColumnCount());
	updates.Verify();

	auto count = updates.size();
	if (count == 0) {
		return;
	}

	if (!IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction",
		    GetTableName(), TableModification());
	}

	// first verify that no constraints are violated
	VerifyUpdateConstraints(*state.constraint_state, context, updates, column_ids);

	// now perform the actual update
	Vector max_row_id_vec(Value::BIGINT(MAX_ROW_ID));
	Vector row_ids_slice(LogicalType::BIGINT);
	DataChunk updates_slice;
	updates_slice.InitializeEmpty(updates.GetTypes());

	SelectionVector sel_local_update(count), sel_global_update(count);
	auto n_local_update = VectorOperations::GreaterThanEquals(row_ids, max_row_id_vec, nullptr, count,
	                                                          &sel_local_update, &sel_global_update);
	auto n_global_update = count - n_local_update;

	// row id > MAX_ROW_ID? transaction-local storage
	if (n_local_update > 0) {
		updates_slice.Slice(updates, sel_local_update, n_local_update);
		updates_slice.Flatten();
		row_ids_slice.Slice(row_ids, sel_local_update, n_local_update);
		row_ids_slice.Flatten(n_local_update);

		LocalStorage::Get(context, db).Update(*this, row_ids_slice, column_ids, updates_slice);
	}

	// otherwise global storage
	if (n_global_update > 0) {
		auto &transaction = DuckTransaction::Get(context, db);
		transaction.ModifyTable(*this);
		updates_slice.Slice(updates, sel_global_update, n_global_update);
		updates_slice.Flatten();
		row_ids_slice.Slice(row_ids, sel_global_update, n_global_update);
		row_ids_slice.Flatten(n_global_update);

		row_groups->Update(transaction, FlatVector::GetData<row_t>(row_ids_slice), column_ids, updates_slice);
	}
}